

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O3

void pinThread(int cpu)

{
  ulong uVar1;
  bool bVar2;
  __atomic_base<unsigned_long> _Var3;
  int iVar4;
  int iVar5;
  pthread_t __th;
  int *piVar6;
  ostream *poVar7;
  size_t sVar8;
  undefined8 uVar9;
  ulong uVar10;
  __atomic_base<unsigned_long> _Var11;
  __atomic_base<unsigned_long> _Var12;
  long lVar13;
  long lVar14;
  __atomic_base<unsigned_long> _Var15;
  cpu_set_t cpuset;
  long *plStack_398;
  long lStack_390;
  int iStack_384;
  undefined1 auStack_380 [128];
  ulong uStack_300;
  __atomic_base<unsigned_long> _Stack_2c0;
  size_t sStack_280;
  undefined1 auStack_240 [128];
  size_t sStack_1c0;
  atomic<unsigned_long> aStack_180;
  __atomic_base<unsigned_long> _Stack_140;
  cpu_set_t local_88;
  
  if (cpu < 0) {
    return;
  }
  local_88.__bits[0xe] = 0;
  local_88.__bits[0xf] = 0;
  local_88.__bits[0xc] = 0;
  local_88.__bits[0xd] = 0;
  local_88.__bits[10] = 0;
  local_88.__bits[0xb] = 0;
  local_88.__bits[8] = 0;
  local_88.__bits[9] = 0;
  local_88.__bits[6] = 0;
  local_88.__bits[7] = 0;
  local_88.__bits[4] = 0;
  local_88.__bits[5] = 0;
  local_88.__bits[2] = 0;
  local_88.__bits[3] = 0;
  local_88.__bits[0] = 0;
  local_88.__bits[1] = 0;
  if ((uint)cpu < 0x400) {
    local_88.__bits[(uint)cpu >> 6] = local_88.__bits[(uint)cpu >> 6] | 1L << ((byte)cpu & 0x3f);
  }
  __th = pthread_self();
  lVar14 = 0x80;
  iVar4 = pthread_setaffinity_np(__th,0x80,&local_88);
  iVar5 = (int)__th;
  if (iVar4 != -1) {
    return;
  }
  pinThread();
  iStack_384 = -1;
  lVar13 = 0xffffffff;
  if (iVar5 != 3) {
LAB_001025c9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SPSCQueue:",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    auStack_380._64_8_ = 0;
    uStack_300 = 0;
    _Stack_2c0._M_i = 0;
    sStack_280 = 0;
    auStack_380._0_8_ = 0x989681;
    auStack_380._8_8_ = operator_new(0x2625a84);
    plStack_398 = (long *)0x0;
    auStack_240._0_8_ = operator_new(0x18);
    *(undefined ***)auStack_240._0_8_ = &PTR___State_00105cb8;
    *(int **)(auStack_240._0_8_ + 8) = &iStack_384;
    *(undefined1 **)(auStack_240._0_8_ + 0x10) = auStack_380;
    std::thread::_M_start_thread(&plStack_398,auStack_240,0);
    if (auStack_240._0_8_ != 0) {
      (**(code **)(*(long *)auStack_240._0_8_ + 8))();
    }
    iVar5 = (int)lVar13;
    pinThread(iVar5);
    std::chrono::_V2::steady_clock::now();
    iVar4 = 0;
    uVar10 = uStack_300;
    do {
      uVar1 = auStack_380._64_8_ + 1;
      _Var11._M_i = uVar10;
      _Var3._M_i = uStack_300;
      _Var12._M_i = 0;
      _Var15._M_i = 0;
      if (uVar1 != auStack_380._0_8_) {
        _Var12._M_i = uVar1;
        _Var15._M_i = uVar1;
      }
      do {
        uStack_300 = _Var3._M_i;
        uVar1 = _Var11._M_i;
        bVar2 = _Var12._M_i == uVar10;
        _Var11._M_i = _Stack_2c0._M_i;
        _Var3._M_i = _Stack_2c0._M_i;
        _Var12._M_i = _Stack_2c0._M_i;
      } while (bVar2);
      *(int *)(auStack_380._8_8_ + (auStack_380._64_8_ + 0x10) * 4) = iVar4;
      iVar4 = iVar4 + 1;
      uVar10 = uVar1;
      auStack_380._64_8_ = _Var15._M_i;
    } while (iVar4 != 10000000);
    std::thread::join();
    std::chrono::_V2::steady_clock::now();
    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ops/ms",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (plStack_398 == (long *)0x0) {
      rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                ((SPSCQueue<int,_std::allocator<int>_> *)auStack_380);
      auStack_380._64_8_ = 0;
      uStack_300 = 0;
      _Stack_2c0._M_i = 0;
      sStack_280 = 0;
      auStack_380._0_8_ = 0x989681;
      auStack_380._8_8_ = operator_new(0x2625a84);
      auStack_240._64_8_ = 0;
      sStack_1c0 = 0;
      aStack_180.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      _Stack_140._M_i = 0;
      auStack_240._0_8_ = 0x989681;
      auStack_240._8_8_ = operator_new(0x2625a84);
      lStack_390 = 0;
      plStack_398 = (long *)operator_new(0x20);
      *plStack_398 = (long)&PTR___State_00105cf8;
      plStack_398[1] = (long)&iStack_384;
      plStack_398[2] = (long)auStack_380;
      plStack_398[3] = (long)auStack_240;
      std::thread::_M_start_thread(&lStack_390,&plStack_398,0);
      if (plStack_398 != (long *)0x0) {
        (**(code **)(*plStack_398 + 8))();
      }
      pinThread(iVar5);
      iVar4 = 0;
      std::chrono::_V2::steady_clock::now();
      do {
        _Var12._M_i = uStack_300;
        _Var11._M_i = 0;
        if (auStack_380._64_8_ + 1 != auStack_380._0_8_) {
          _Var11._M_i = auStack_380._64_8_ + 1;
        }
        do {
          uStack_300 = _Var12._M_i;
          _Var12._M_i = _Stack_2c0._M_i;
        } while (_Var11._M_i == uStack_300);
        *(int *)(auStack_380._8_8_ + (auStack_380._64_8_ + 0x10) * 4) = iVar4;
        do {
          while (_Var12._M_i = _Stack_140._M_i,
                aStack_180.super___atomic_base<unsigned_long>._M_i !=
                (__atomic_base<unsigned_long>)_Stack_140._M_i) {
            if ((int *)(auStack_240._8_8_ +
                       ((long)aStack_180.super___atomic_base<unsigned_long>._M_i + 0x10) * 4) !=
                (int *)0x0) goto LAB_00102916;
          }
          _Stack_140._M_i = auStack_240._64_8_;
        } while ((auStack_240._64_8_ == _Var12._M_i) ||
                ((int *)(auStack_240._8_8_ + _Var12._M_i * 4) == (int *)0xffffffffffffffc0));
LAB_00102916:
        auStack_380._64_8_ = _Var11._M_i;
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::pop
                  ((SPSCQueue<int,_std::allocator<int>_> *)auStack_240);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 10000000);
      std::chrono::_V2::steady_clock::now();
      std::thread::join();
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ns RTT",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (lStack_390 == 0) {
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                  ((SPSCQueue<int,_std::allocator<int>_> *)auStack_240);
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                  ((SPSCQueue<int,_std::allocator<int>_> *)auStack_380);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"boost::lockfree::spsc:",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        auStack_380._0_8_ = 0;
        auStack_380._64_8_ = 0;
        auStack_380._72_8_ = 0x989681;
        auStack_380._80_8_ = operator_new(0x2625a04);
        plStack_398 = (long *)0x0;
        auStack_240._0_8_ = operator_new(0x18);
        *(undefined ***)auStack_240._0_8_ = &PTR___State_00105d38;
        *(int **)(auStack_240._0_8_ + 8) = &iStack_384;
        *(SPSCQueue<int,_std::allocator<int>_> **)(auStack_240._0_8_ + 0x10) =
             (SPSCQueue<int,_std::allocator<int>_> *)auStack_380;
        std::thread::_M_start_thread(&plStack_398,auStack_240,0);
        if (auStack_240._0_8_ != 0) {
          (**(code **)(*(long *)auStack_240._0_8_ + 8))();
        }
        pinThread(iVar5);
        iVar4 = 0;
        std::chrono::_V2::steady_clock::now();
        do {
          do {
            _Var12._M_i = auStack_380._72_8_ + auStack_380._0_8_ + 1;
            do {
              _Var12._M_i = _Var12._M_i - auStack_380._72_8_;
            } while ((ulong)auStack_380._72_8_ <= _Var12._M_i);
          } while (auStack_380._64_8_ == _Var12._M_i);
          *(int *)(auStack_380._80_8_ + auStack_380._0_8_ * 4) = iVar4;
          iVar4 = iVar4 + 1;
          auStack_380._0_8_ = _Var12._M_i;
        } while (iVar4 != 10000000);
        std::thread::join();
        std::chrono::_V2::steady_clock::now();
        poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ops/ms",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (plStack_398 == (long *)0x0) {
          boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
          ~runtime_sized_ringbuffer
                    ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)auStack_380);
          auStack_380._0_8_ = 0;
          auStack_380._64_8_ = 0;
          auStack_380._72_8_ = 0x989681;
          auStack_380._80_8_ = operator_new(0x2625a04);
          auStack_240._0_8_ = 0;
          auStack_240._64_8_ = 0;
          auStack_240._72_8_ = 0x989681;
          auStack_240._80_8_ = operator_new(0x2625a04);
          lStack_390 = 0;
          plStack_398 = (long *)operator_new(0x20);
          *plStack_398 = (long)&PTR___State_00105d78;
          plStack_398[1] = (long)&iStack_384;
          plStack_398[2] = (long)auStack_380;
          plStack_398[3] = (long)auStack_240;
          std::thread::_M_start_thread(&lStack_390,&plStack_398,0);
          if (plStack_398 != (long *)0x0) {
            (**(code **)(*plStack_398 + 8))();
          }
          pinThread(iVar5);
          iVar4 = 0;
          std::chrono::_V2::steady_clock::now();
          do {
            do {
              _Var12._M_i = auStack_380._72_8_ + auStack_380._0_8_ + 1;
              do {
                _Var12._M_i = _Var12._M_i - auStack_380._72_8_;
              } while ((ulong)auStack_380._72_8_ <= _Var12._M_i);
            } while (auStack_380._64_8_ == _Var12._M_i);
            *(int *)(auStack_380._80_8_ + auStack_380._0_8_ * 4) = iVar4;
            auStack_380._0_8_ = _Var12._M_i;
            do {
              sVar8 = boost::lockfree::detail::ringbuffer_base<int>::pop
                                ((ringbuffer_base<int> *)auStack_240,(int *)&plStack_398,1,
                                 (int *)auStack_240._80_8_,auStack_240._72_8_);
            } while (sVar8 != 1);
            iVar4 = iVar4 + 1;
          } while (iVar4 != 10000000);
          std::chrono::_V2::steady_clock::now();
          std::thread::join();
          poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ns RTT",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (lStack_390 == 0) {
            boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
            ~runtime_sized_ringbuffer
                      ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)auStack_240);
            boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
            ~runtime_sized_ringbuffer
                      ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)auStack_380);
            return;
          }
        }
      }
    }
    std::terminate();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_380,*(char **)(lVar14 + 8),(allocator<char> *)&plStack_398);
  uVar9 = auStack_380._0_8_;
  piVar6 = __errno_location();
  iVar4 = *piVar6;
  *piVar6 = 0;
  lVar13 = strtol((char *)uVar9,(char **)auStack_240,10);
  if (auStack_240._0_8_ == uVar9) {
    std::__throw_invalid_argument("stoi");
LAB_00102d57:
    std::__throw_out_of_range("stoi");
  }
  else {
    iVar5 = (int)lVar13;
    if ((iVar5 != lVar13) || (*piVar6 == 0x22)) goto LAB_00102d57;
    if (*piVar6 == 0) {
      *piVar6 = iVar4;
    }
    iStack_384 = iVar5;
    if (auStack_380._0_8_ != (long)auStack_380 + 0x10U) {
      operator_delete((void *)auStack_380._0_8_,auStack_380._16_8_ + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_380,*(char **)(lVar14 + 0x10),(allocator<char> *)&plStack_398);
    uVar9 = auStack_380._0_8_;
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar13 = strtol((char *)auStack_380._0_8_,(char **)auStack_240,10);
    if (auStack_240._0_8_ != uVar9) {
      if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        if (auStack_380._0_8_ != (long)auStack_380 + 0x10U) {
          operator_delete((void *)auStack_380._0_8_,auStack_380._16_8_ + 1);
        }
        goto LAB_001025c9;
      }
      goto LAB_00102d6f;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00102d6f:
  uVar9 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar9);
}

Assistant:

void pinThread(int cpu) {
  if (cpu < 0) {
    return;
  }
  cpu_set_t cpuset;
  CPU_ZERO(&cpuset);
  CPU_SET(cpu, &cpuset);
  if (pthread_setaffinity_np(pthread_self(), sizeof(cpu_set_t), &cpuset) ==
      -1) {
    perror("pthread_setaffinity_no");
    exit(1);
  }
}